

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [24];
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  void *pvVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  undefined1 auVar14 [32];
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *palVar20;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int64_t *ptr_06;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined8 uVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  ulong size;
  int iVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  __m256i_64_t h;
  undefined8 in_stack_fffffffffffffc60;
  __m256i *ptr_07;
  undefined1 local_280 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_1e0 [32];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar8 = (profile->profile64).score;
    if (pvVar8 == (void *)0x0) {
      parasail_nw_stats_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar42 = profile->s1Len;
        if ((int)uVar42 < 1) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_1();
        }
        else {
          local_240._0_4_ = gap;
          iVar40 = uVar42 - 1;
          uVar39 = (ulong)uVar42 + 3;
          size = uVar39 >> 2;
          iVar38 = (int)size;
          uVar42 = iVar40 % iVar38;
          uVar30 = CONCAT44(0,open);
          iVar26 = -open;
          iVar18 = ppVar9->min;
          local_220._0_4_ = iVar26;
          pvVar10 = (profile->profile64).matches;
          pvVar11 = (profile->profile64).similar;
          uVar29 = 0x8000000000000000 - (long)iVar18;
          if (iVar18 != iVar26 && SBORROW4(iVar18,iVar26) == iVar18 + open < 0) {
            uVar29 = uVar30 | 0x8000000000000000;
          }
          local_280._0_8_ = uVar29;
          iVar18 = ppVar9->max;
          ppVar19 = parasail_result_new_stats();
          if (ppVar19 != (parasail_result_t *)0x0) {
            ppVar19->flag = ppVar19->flag | 0x4810401;
            b = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            palVar20 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            ptr_04 = parasail_memalign___m256i(0x20,size);
            ptr_05 = parasail_memalign___m256i(0x20,size);
            ptr_06 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_06 != (int64_t *)0x0 &&
                (ptr_05 != (__m256i *)0x0 && (ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0))
                ) && ((ptr_02 != (__m256i *)0x0 &&
                      (ptr_01 != (__m256i *)0x0 &&
                      (ptr_00 != (__m256i *)0x0 && palVar20 != (__m256i *)0x0))) &&
                     ((b_04 != (__m256i *)0x0 && (b_03 != (__m256i *)0x0 && ptr != (__m256i *)0x0))
                     && ((b_02 != (__m256i *)0x0 && b_01 != (__m256i *)0x0) &&
                        (b_00 != (__m256i *)0x0 && b != (__m256i *)0x0))))) {
              iVar15 = s2Len + -1;
              iVar16 = 3 - iVar40 / iVar38;
              uVar33 = CONCAT44(0,gap);
              auVar51._8_4_ = gap;
              auVar51._0_8_ = uVar33;
              auVar51._12_4_ = 0;
              auVar51._16_4_ = gap;
              auVar51._20_4_ = 0;
              auVar51._24_4_ = gap;
              auVar51._28_4_ = 0;
              uVar29 = uVar29 + 1;
              lVar27 = 0x7ffffffffffffffe - (long)iVar18;
              auVar52._8_8_ = uVar39;
              auVar52._0_8_ = uVar39;
              auVar52._16_8_ = uVar39;
              auVar52._24_8_ = uVar39;
              auVar52 = vpsrlq_avx2(auVar52,2);
              auVar13 = vpblendd_avx2(auVar52,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar84 = ZEXT832(uVar29);
              lVar21 = (long)-(gap * iVar38);
              auVar53._8_8_ = lVar21;
              auVar53._0_8_ = lVar21;
              auVar53._16_8_ = lVar21;
              auVar53._24_8_ = lVar21;
              auVar52 = vpblendd_avx2(auVar53,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar52 = vpaddq_avx2(ZEXT832(uVar29),auVar52);
              alVar2[1] = (longlong)ptr;
              alVar2[0] = in_stack_fffffffffffffc60;
              alVar2[2] = (longlong)palVar20;
              alVar2[3] = (longlong)b_00;
              ptr_07 = palVar20;
              parasail_memset___m256i(b_03,alVar2,size);
              alVar3[1] = (longlong)ptr;
              alVar3[0] = in_stack_fffffffffffffc60;
              alVar3[2] = (longlong)ptr_07;
              alVar3[3] = (longlong)b_00;
              parasail_memset___m256i(b_04,alVar3,size);
              alVar4[1] = (longlong)ptr;
              alVar4[0] = in_stack_fffffffffffffc60;
              alVar4[2] = (longlong)ptr_07;
              alVar4[3] = (longlong)b_00;
              parasail_memset___m256i(palVar20,alVar4,size);
              alVar5[1] = (longlong)ptr;
              alVar5[0] = in_stack_fffffffffffffc60;
              alVar5[2] = (longlong)ptr_07;
              alVar5[3] = (longlong)b_00;
              parasail_memset___m256i(b,alVar5,size);
              c[1] = (longlong)ptr;
              c[0] = in_stack_fffffffffffffc60;
              c[2] = (longlong)ptr_07;
              c[3] = (longlong)b_00;
              parasail_memset___m256i(b_00,c,size);
              c_00[1] = (longlong)ptr;
              c_00[0] = in_stack_fffffffffffffc60;
              c_00[2] = (longlong)ptr_07;
              c_00[3] = (longlong)b_00;
              parasail_memset___m256i(b_01,c_00,size);
              c_01[1] = (longlong)ptr;
              c_01[0] = in_stack_fffffffffffffc60;
              c_01[2] = (longlong)ptr_07;
              c_01[3] = (longlong)b_00;
              parasail_memset___m256i(b_02,c_01,size);
              auVar12._8_4_ = open;
              auVar12._0_8_ = uVar30;
              auVar12._12_4_ = 0;
              auVar12._16_4_ = open;
              auVar12._20_4_ = 0;
              auVar12._24_4_ = open;
              auVar12._28_4_ = 0;
              auVar53 = vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar12);
              uVar17 = iVar38 - 1;
              lVar21 = (ulong)uVar17 << 5;
              auVar64._8_8_ = 1;
              auVar64._0_8_ = 1;
              auVar64._16_8_ = 1;
              auVar64._24_8_ = 1;
              auVar12 = vpcmpeqd_avx2(auVar84,auVar84);
              uVar39 = size;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar21) = auVar53;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar21) = auVar64;
                auVar53 = vpsubq_avx2(auVar53,auVar51);
                auVar64 = vpsubq_avx2(auVar64,auVar12);
                lVar21 = lVar21 + -0x20;
                iVar18 = (int)uVar39;
                uVar28 = iVar18 - 1;
                uVar39 = (ulong)uVar28;
              } while (uVar28 != 0 && 0 < iVar18);
              lVar21 = (long)iVar26;
              uVar39 = 0;
              do {
                lVar34 = 0;
                lVar32 = lVar21;
                do {
                  local_80[lVar34] = lVar32;
                  lVar34 = lVar34 + 1;
                  lVar32 = lVar32 - size * uVar33;
                } while (lVar34 != 4);
                palVar20 = ptr + uVar39;
                (*palVar20)[0] = local_80[0];
                (*palVar20)[1] = local_80[1];
                (*palVar20)[2] = local_80[2];
                (*palVar20)[3] = local_80[3];
                uVar39 = uVar39 + 1;
                lVar21 = lVar21 - uVar33;
              } while (uVar39 != size);
              *ptr_06 = 0;
              lVar21 = (long)iVar26;
              uVar39 = 1;
              do {
                ptr_06[uVar39] = lVar21;
                uVar39 = uVar39 + 1;
                lVar21 = lVar21 - uVar33;
              } while (s2Len + 1 != uVar39);
              uVar39 = 1;
              if (1 < s2Len) {
                uVar39 = (ulong)(uint)s2Len;
              }
              lVar21 = (ulong)(iVar38 + (uint)(iVar38 == 0)) << 5;
              uVar33 = 0;
              auVar89 = ZEXT3264(CONCAT824(uVar29,CONCAT816(uVar29,CONCAT88(uVar29,uVar29))));
              local_1e0._8_8_ = lVar27;
              local_1e0._0_8_ = lVar27;
              local_1e0._16_8_ = lVar27;
              local_1e0._24_8_ = lVar27;
              do {
                alVar2 = ptr[uVar17];
                alVar3 = b_03[uVar17];
                alVar4 = b_04[uVar17];
                alVar5 = ptr_07[uVar17];
                auVar45 = alVar2._0_16_;
                auVar84._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar45;
                auVar84._16_16_ = ZEXT116(0) * alVar2._16_16_ + ZEXT116(1) * auVar45;
                auVar12 = vpalignr_avx2((undefined1  [32])alVar2,auVar84,8);
                auVar53 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                auVar53 = vpalignr_avx2((undefined1  [32])alVar3,auVar53,8);
                auVar64 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                auVar64 = vpalignr_avx2((undefined1  [32])alVar4,auVar64,8);
                auVar84 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                auVar84 = vpalignr_avx2((undefined1  [32])alVar5,auVar84,8);
                auVar65 = vpblendd_avx2(auVar12,ZEXT832((ulong)ptr_06[uVar33]),3);
                lVar32 = (long)ppVar9->mapper[(byte)s2[uVar33]] * size * 0x20;
                auVar97._8_8_ = uVar29;
                auVar97._0_8_ = uVar29;
                auVar97._16_8_ = uVar29;
                auVar97._24_8_ = uVar29;
                auVar12 = vpsubq_avx2(auVar97,(undefined1  [32])*ptr_04);
                auVar101 = ZEXT864(0) << 0x40;
                lVar34 = 0;
                auVar93 = ZEXT864(0) << 0x40;
                auVar94 = ZEXT864(0) << 0x40;
                do {
                  auVar6 = *(undefined1 (*) [32])((long)*ptr + lVar34);
                  auVar54 = *(undefined1 (*) [32])((long)*b_03 + lVar34);
                  auVar85 = *(undefined1 (*) [32])((long)*b_04 + lVar34);
                  auVar7._8_4_ = open;
                  auVar7._0_8_ = uVar30;
                  auVar7._12_4_ = 0;
                  auVar7._16_4_ = open;
                  auVar7._20_4_ = 0;
                  auVar7._24_4_ = open;
                  auVar7._28_4_ = 0;
                  auVar92 = vpsubq_avx2(auVar6,auVar7);
                  auVar100 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b + lVar34),auVar51);
                  auVar86 = vpcmpgtq_avx2(auVar92,auVar100);
                  auVar80 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar34),auVar54,
                                          auVar86);
                  auVar98 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_01 + lVar34),auVar85,
                                          auVar86);
                  auVar7 = *(undefined1 (*) [32])((long)*ptr_07 + lVar34);
                  auVar86 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_02 + lVar34),auVar7,
                                          auVar86);
                  uVar24 = auVar100._0_8_;
                  if ((long)auVar100._0_8_ < (long)auVar92._0_8_) {
                    uVar24 = auVar92._0_8_;
                  }
                  uVar22 = vpextrq_avx(auVar92._0_16_,1);
                  uVar37 = vpextrq_avx(auVar100._0_16_,1);
                  if ((long)uVar37 < (long)uVar22) {
                    uVar37 = uVar22;
                  }
                  uVar23 = vpextrq_avx(auVar92._16_16_,1);
                  uVar41 = vpextrq_avx(auVar100._16_16_,1);
                  uVar22 = auVar100._16_8_;
                  if ((long)auVar100._16_8_ < (long)auVar92._16_8_) {
                    uVar22 = auVar92._16_8_;
                  }
                  if ((long)uVar41 < (long)uVar23) {
                    uVar41 = uVar23;
                  }
                  auVar12 = vpaddq_avx2(auVar12,*(undefined1 (*) [32])((long)*ptr_04 + lVar34));
                  uVar23 = auVar12._0_8_;
                  if ((long)auVar12._0_8_ < (long)auVar97._0_8_) {
                    uVar23 = auVar97._0_8_;
                  }
                  uVar43 = vpextrq_avx(auVar97._0_16_,1);
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar41;
                  auVar90._8_8_ = 0;
                  auVar90._0_8_ = uVar22;
                  auVar45 = vpunpcklqdq_avx(auVar90,auVar45);
                  uVar36 = vpextrq_avx(auVar12._0_16_,1);
                  if ((long)uVar36 < (long)uVar43) {
                    uVar36 = uVar43;
                  }
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = uVar37;
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = uVar24;
                  auVar90 = vpunpcklqdq_avx(auVar102,auVar91);
                  uVar31 = vpextrq_avx(auVar97._16_16_,1);
                  uVar44 = vpextrq_avx(auVar12._16_16_,1);
                  uVar43 = auVar12._16_8_;
                  if ((long)auVar12._16_8_ < (long)auVar97._16_8_) {
                    uVar43 = auVar97._16_8_;
                  }
                  auVar92._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar90;
                  auVar92._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
                  if ((long)uVar44 < (long)uVar31) {
                    uVar44 = uVar31;
                  }
                  auVar97 = vpcmpgtq_avx2(auVar12,auVar97);
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = uVar44;
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uVar43;
                  auVar45 = vpunpcklqdq_avx(auVar55,auVar46);
                  auVar100 = vblendvpd_avx(auVar94._0_32_,local_240,auVar97);
                  auVar94 = ZEXT3264(auVar100);
                  auVar87 = vblendvpd_avx(auVar93._0_32_,local_280,auVar97);
                  auVar93 = ZEXT3264(auVar87);
                  auVar12 = vpaddq_avx2(auVar65,*(undefined1 (*) [32])
                                                 ((long)pvVar8 + lVar34 + lVar32));
                  auVar53 = vpaddq_avx2(auVar53,*(undefined1 (*) [32])
                                                 ((long)pvVar10 + lVar34 + lVar32));
                  auVar64 = vpaddq_avx2(auVar64,*(undefined1 (*) [32])
                                                 ((long)pvVar11 + lVar34 + lVar32));
                  auVar65 = vpaddq_avx2(local_220,*(undefined1 (*) [32])((long)*ptr_05 + lVar34));
                  auVar99 = vblendvpd_avx(auVar101._0_32_,auVar65,auVar97);
                  auVar101 = ZEXT3264(auVar99);
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ = uVar36;
                  auVar105._8_8_ = 0;
                  auVar105._0_8_ = uVar23;
                  auVar90 = vpunpcklqdq_avx(auVar105,auVar103);
                  auVar65 = vpcmpeqd_avx2(local_220,local_220);
                  auVar66 = vpsubq_avx2(auVar84,auVar65);
                  *(undefined1 (*) [32])((long)*b + lVar34) = auVar92;
                  auVar65 = vpsubq_avx2(auVar86,auVar65);
                  auVar84 = vpcmpgtq_avx2(auVar92,auVar12);
                  *(undefined1 (*) [32])((long)*b_00 + lVar34) = auVar80;
                  local_240 = vblendvpd_avx(auVar53,auVar80,auVar84);
                  *(undefined1 (*) [32])((long)*b_01 + lVar34) = auVar98;
                  local_280 = vblendvpd_avx(auVar64,auVar98,auVar84);
                  local_220 = vblendvpd_avx(auVar66,auVar65,auVar84);
                  *(undefined1 (*) [32])((long)*b_02 + lVar34) = auVar65;
                  if ((long)uVar24 <= (long)auVar12._0_8_) {
                    uVar24 = auVar12._0_8_;
                  }
                  uVar31 = vpextrq_avx(auVar12._0_16_,1);
                  auVar97._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar90;
                  auVar97._16_16_ = ZEXT116(1) * auVar45;
                  uVar35 = vpextrq_avx(auVar12._16_16_,1);
                  if ((long)uVar37 <= (long)uVar31) {
                    uVar37 = uVar31;
                  }
                  if ((long)uVar22 <= (long)auVar12._16_8_) {
                    uVar22 = auVar12._16_8_;
                  }
                  if ((long)uVar41 <= (long)uVar35) {
                    uVar41 = uVar35;
                  }
                  *(undefined1 (*) [32])((long)*ptr + lVar34) = auVar12;
                  *(undefined1 (*) [32])((long)*b_03 + lVar34) = auVar53;
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = uVar37;
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = uVar24;
                  auVar45 = vpunpcklqdq_avx(auVar70,auVar47);
                  *(undefined1 (*) [32])((long)*b_04 + lVar34) = auVar64;
                  auVar56._8_8_ = 0;
                  auVar56._0_8_ = uVar22;
                  auVar80._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar45;
                  auVar80._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
                  *(undefined1 (*) [32])((long)*ptr_07 + lVar34) = auVar66;
                  auVar65._8_8_ = uVar41;
                  auVar65._0_8_ = uVar41;
                  auVar65._16_8_ = uVar41;
                  auVar65._24_8_ = uVar41;
                  auVar12 = vpblendd_avx2(auVar80,auVar65,0xc0);
                  lVar34 = lVar34 + 0x20;
                  auVar84 = auVar7;
                  auVar65 = auVar6;
                  auVar53 = auVar54;
                  auVar64 = auVar85;
                } while (lVar21 != lVar34);
                auVar6._8_4_ = open;
                auVar6._0_8_ = uVar30;
                auVar6._12_4_ = 0;
                auVar6._16_4_ = open;
                auVar6._20_4_ = 0;
                auVar6._24_4_ = open;
                auVar6._28_4_ = 0;
                auVar54._8_8_ = uVar37;
                auVar54._0_8_ = uVar37;
                auVar54._16_8_ = uVar37;
                auVar54._24_8_ = uVar37;
                auVar53 = vpunpcklqdq_avx2(auVar54,auVar80);
                auVar12 = vperm2f128_avx(local_240,local_240,8);
                local_240 = vpalignr_avx2(local_240,auVar12,8);
                auVar12 = vperm2f128_avx(local_280,local_280,8);
                local_280 = vpalignr_avx2(local_280,auVar12,8);
                uVar41 = ptr_06[uVar33 + 1];
                uVar33 = uVar33 + 1;
                auVar53 = vpblendd_avx2(auVar53,ZEXT832(uVar41),3);
                auVar12 = vpaddq_avx2(auVar53,(undefined1  [32])*ptr_04);
                uVar31 = auVar12._0_8_;
                if ((long)auVar12._0_8_ < (long)uVar23) {
                  uVar31 = uVar23;
                }
                uVar23 = vpextrq_avx(auVar12._0_16_,1);
                auVar64 = vperm2f128_avx(local_220,local_220,8);
                if ((long)uVar23 < (long)uVar36) {
                  uVar23 = uVar36;
                }
                local_220 = vpalignr_avx2(local_220,auVar64,8);
                uVar36 = auVar12._16_8_;
                if ((long)auVar12._16_8_ < (long)uVar43) {
                  uVar36 = uVar43;
                }
                uVar43 = vpextrq_avx(auVar12._16_16_,1);
                auVar12 = vpcmpgtq_avx2(auVar97,auVar12);
                if ((long)uVar43 < (long)uVar44) {
                  uVar43 = uVar44;
                }
                auVar57._8_8_ = 0;
                auVar57._0_8_ = uVar43;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = uVar36;
                auVar45 = vpunpcklqdq_avx(auVar71,auVar57);
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar23;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar31;
                auVar90 = vpunpcklqdq_avx(auVar72,auVar58);
                auVar64 = vblendvpd_avx(local_240,auVar100,auVar12);
                auVar84 = vblendvpd_avx(local_280,auVar87,auVar12);
                auVar65 = vpaddq_avx2(local_220,(undefined1  [32])*ptr_05);
                auVar85._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar90;
                auVar85._16_16_ = ZEXT116(1) * auVar45;
                auVar12 = vblendvpd_avx(auVar65,auVar99,auVar12);
                iVar18 = 1;
                do {
                  auVar65 = vperm2i128_avx2(auVar85,auVar85,8);
                  auVar65 = vpalignr_avx2(auVar85,auVar65,8);
                  auVar97 = vpaddq_avx2(auVar52,auVar65);
                  auVar65 = vperm2f128_avx(auVar64,auVar64,8);
                  auVar54 = vpalignr_avx2(auVar64,auVar65,8);
                  auVar65 = vperm2f128_avx(auVar84,auVar84,8);
                  auVar7 = vpalignr_avx2(auVar84,auVar65,8);
                  auVar65 = vperm2f128_avx(auVar12,auVar12,8);
                  auVar65 = vpalignr_avx2(auVar12,auVar65,8);
                  auVar65 = vpaddq_avx2(auVar13,auVar65);
                  auVar80 = vpcmpgtq_avx2(auVar85,auVar97);
                  uVar23 = auVar97._0_8_;
                  if ((long)auVar97._0_8_ < (long)auVar85._0_8_) {
                    uVar23 = auVar85._0_8_;
                  }
                  uVar43 = vpextrq_avx(auVar85._0_16_,1);
                  uVar36 = vpextrq_avx(auVar97._0_16_,1);
                  if ((long)uVar36 < (long)uVar43) {
                    uVar36 = uVar43;
                  }
                  uVar43 = auVar97._16_8_;
                  if ((long)auVar97._16_8_ < (long)auVar85._16_8_) {
                    uVar43 = auVar85._16_8_;
                  }
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = uVar36;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = uVar23;
                  auVar45 = vpunpcklqdq_avx(auVar96,auVar95);
                  lVar34 = vpextrq_avx(auVar85._16_16_,1);
                  auVar104._8_8_ = 0;
                  auVar104._0_8_ = uVar43;
                  auVar98._0_16_ = ZEXT116(0) * auVar104 + ZEXT116(1) * auVar45;
                  auVar98._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar104;
                  lVar32 = vpextrq_avx(auVar97._16_16_,1);
                  if (lVar32 < lVar34) {
                    lVar32 = lVar34;
                  }
                  auVar86._8_8_ = lVar32;
                  auVar86._0_8_ = lVar32;
                  auVar86._16_8_ = lVar32;
                  auVar86._24_8_ = lVar32;
                  auVar64 = vblendvpd_avx(auVar54,auVar64,auVar80);
                  auVar84 = vblendvpd_avx(auVar7,auVar84,auVar80);
                  auVar85 = vpblendd_avx2(auVar98,auVar86,0xc0);
                  auVar12 = vblendvpd_avx(auVar65,auVar12,auVar80);
                  iVar18 = iVar18 + -1;
                } while (iVar18 == 0);
                auVar87._8_8_ = uVar36;
                auVar87._0_8_ = uVar36;
                auVar87._16_8_ = uVar36;
                auVar87._24_8_ = uVar36;
                auVar65 = vperm2i128_avx2(auVar87,auVar87,0x18);
                auVar97 = vpalignr_avx2(auVar98,auVar65,8);
                auVar65 = vperm2f128_avx(auVar64,auVar64,8);
                auVar64 = vpalignr_avx2(auVar64,auVar65,8);
                auVar65 = vperm2f128_avx(auVar84,auVar84,8);
                auVar84 = vpalignr_avx2(auVar84,auVar65,8);
                auVar65 = vperm2f128_avx(auVar12,auVar12,8);
                auVar12 = vpalignr_avx2(auVar12,auVar65,8);
                auVar100 = vpaddq_avx2(auVar97,ZEXT832(uVar29));
                if ((long)uVar41 < (long)auVar100._0_8_) {
                  uVar41 = auVar100._0_8_;
                }
                uVar23 = vpextrq_avx(auVar100._0_16_,1);
                if ((long)uVar24 < (long)uVar23) {
                  uVar24 = uVar23;
                }
                if ((long)uVar37 < (long)auVar100._16_8_) {
                  uVar37 = auVar100._16_8_;
                }
                auVar53 = vpcmpgtq_avx2(auVar100,auVar53);
                uVar23 = vpextrq_avx(auVar100._16_16_,1);
                if ((long)uVar22 < (long)uVar23) {
                  uVar22 = uVar23;
                }
                auVar48._8_8_ = 0;
                auVar48._0_8_ = uVar22;
                auVar59._8_8_ = 0;
                auVar59._0_8_ = uVar37;
                auVar45 = vpunpcklqdq_avx(auVar59,auVar48);
                auVar49._8_8_ = 0;
                auVar49._0_8_ = uVar24;
                auVar73._8_8_ = 0;
                auVar73._0_8_ = uVar41;
                auVar90 = vpunpcklqdq_avx(auVar73,auVar49);
                auVar65 = vblendvpd_avx(local_240,auVar64,auVar53);
                auVar97 = vblendvpd_avx(local_280,auVar84,auVar53);
                auVar99._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar90;
                auVar99._16_16_ = ZEXT116(1) * auVar45;
                auVar53 = vblendvpd_avx(local_220,auVar12,auVar53);
                lVar32 = 0;
                auVar89 = ZEXT3264(auVar89._0_32_);
                auVar93 = ZEXT3264(local_1e0);
                do {
                  auVar54 = vpsubq_avx2(auVar99,auVar6);
                  auVar85 = vpsubq_avx2(auVar100,auVar51);
                  uVar22 = vpextrq_avx(auVar54._0_16_,1);
                  uVar37 = vpextrq_avx(auVar85._0_16_,1);
                  uVar24 = auVar85._0_8_;
                  if ((long)auVar85._0_8_ < (long)auVar54._0_8_) {
                    uVar24 = auVar54._0_8_;
                  }
                  if ((long)uVar37 < (long)uVar22) {
                    uVar37 = uVar22;
                  }
                  uVar23 = vpextrq_avx(auVar54._16_16_,1);
                  uVar41 = vpextrq_avx(auVar85._16_16_,1);
                  auVar7 = vpcmpgtq_avx2(auVar54,auVar85);
                  uVar22 = auVar85._16_8_;
                  if ((long)auVar85._16_8_ < (long)auVar54._16_8_) {
                    uVar22 = auVar54._16_8_;
                  }
                  auVar64 = vblendvpd_avx(auVar64,auVar65,auVar7);
                  auVar84 = vblendvpd_avx(auVar84,auVar97,auVar7);
                  uVar36 = *(ulong *)((long)*ptr + lVar32);
                  if ((long)uVar41 < (long)uVar23) {
                    uVar41 = uVar23;
                  }
                  uVar23 = *(ulong *)((long)*ptr + lVar32 + 8);
                  uVar43 = *(ulong *)((long)*b + lVar32);
                  uVar44 = *(ulong *)((long)*b + lVar32 + 8);
                  if ((long)uVar43 < (long)uVar36) {
                    uVar43 = uVar36;
                  }
                  uVar36 = *(ulong *)((long)*ptr + lVar32 + 0x18);
                  uVar31 = *(ulong *)((long)*ptr + lVar32 + 0x10);
                  if ((long)uVar44 < (long)uVar23) {
                    uVar44 = uVar23;
                  }
                  uVar23 = *(ulong *)((long)*b + lVar32 + 0x10);
                  if ((long)uVar23 < (long)uVar31) {
                    uVar23 = uVar31;
                  }
                  uVar31 = *(ulong *)((long)*b + lVar32 + 0x18);
                  if ((long)uVar31 < (long)uVar36) {
                    uVar31 = uVar36;
                  }
                  if ((long)uVar43 <= (long)uVar24) {
                    uVar43 = uVar24;
                  }
                  if ((long)uVar44 <= (long)uVar37) {
                    uVar44 = uVar37;
                  }
                  if ((long)uVar23 <= (long)uVar22) {
                    uVar23 = uVar22;
                  }
                  if ((long)uVar31 <= (long)uVar41) {
                    uVar31 = uVar41;
                  }
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = uVar41;
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = uVar22;
                  auVar45 = vpunpcklqdq_avx(auVar60,auVar50);
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = uVar37;
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ = uVar24;
                  auVar90 = vpunpcklqdq_avx(auVar74,auVar67);
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar31;
                  auVar75._8_8_ = 0;
                  auVar75._0_8_ = uVar23;
                  auVar91 = vpunpcklqdq_avx(auVar75,auVar61);
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar44;
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar43;
                  auVar102 = vpunpcklqdq_avx(auVar81,auVar76);
                  auVar99._0_16_ = ZEXT116(0) * auVar91 + ZEXT116(1) * auVar102;
                  auVar91 = ZEXT116(1) * auVar91;
                  auVar99._16_16_ = auVar91;
                  pauVar1 = (undefined1 (*) [24])((long)*ptr + lVar32);
                  auVar66._0_8_ = -(ulong)(auVar99._0_8_ == *(long *)*pauVar1);
                  auVar66._8_8_ = -(ulong)(auVar99._8_8_ == *(long *)(*pauVar1 + 8));
                  auVar66._16_8_ = -(ulong)(auVar91._0_8_ == SUB248(*pauVar1,0x10));
                  auVar66._24_8_ = -(ulong)(auVar91._8_8_ == *(long *)pauVar1[1]);
                  uVar37 = vpextrq_avx(auVar93._0_16_,1);
                  uVar24 = auVar93._0_8_;
                  if ((long)uVar43 <= (long)auVar93._0_8_) {
                    uVar24 = uVar43;
                  }
                  uVar22 = vpextrq_avx(auVar93._16_16_,1);
                  if ((long)uVar44 <= (long)uVar37) {
                    uVar37 = uVar44;
                  }
                  uVar41 = auVar93._16_8_;
                  if ((long)uVar23 <= (long)auVar93._16_8_) {
                    uVar41 = uVar23;
                  }
                  auVar100._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar90;
                  auVar45 = ZEXT116(1) * auVar45;
                  auVar100._16_16_ = auVar45;
                  if ((long)uVar31 <= (long)uVar22) {
                    uVar22 = uVar31;
                  }
                  auVar69._0_8_ = -(ulong)(auVar99._0_8_ == auVar100._0_8_);
                  auVar69._8_8_ = -(ulong)(auVar99._8_8_ == auVar100._8_8_);
                  auVar69._16_8_ = -(ulong)(auVar91._0_8_ == auVar45._0_8_);
                  auVar69._24_8_ = -(ulong)(auVar91._8_8_ == auVar45._8_8_);
                  auVar65 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar32),auVar64,
                                          auVar69);
                  auVar65 = vblendvpd_avx(auVar65,*(undefined1 (*) [32])((long)*b_03 + lVar32),
                                          auVar66);
                  if ((long)uVar43 < (long)auVar89._0_8_) {
                    uVar43 = auVar89._0_8_;
                  }
                  uVar36 = vpextrq_avx(auVar89._0_16_,1);
                  if ((long)uVar44 < (long)uVar36) {
                    uVar44 = uVar36;
                  }
                  if ((long)uVar23 < (long)auVar89._16_8_) {
                    uVar23 = auVar89._16_8_;
                  }
                  uVar36 = vpextrq_avx(auVar89._16_16_,1);
                  auVar97 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_01 + lVar32),auVar84,
                                          auVar69);
                  auVar97 = vblendvpd_avx(auVar97,*(undefined1 (*) [32])((long)*b_04 + lVar32),
                                          auVar66);
                  if ((long)uVar31 < (long)uVar36) {
                    uVar31 = uVar36;
                  }
                  if ((long)uVar43 <= (long)auVar65._0_8_) {
                    uVar43 = auVar65._0_8_;
                  }
                  uVar36 = vpextrq_avx(auVar65._0_16_,1);
                  if ((long)uVar44 <= (long)uVar36) {
                    uVar44 = uVar36;
                  }
                  if ((long)uVar23 <= (long)auVar65._16_8_) {
                    uVar23 = auVar65._16_8_;
                  }
                  uVar36 = vpextrq_avx(auVar65._16_16_,1);
                  if ((long)uVar31 <= (long)uVar36) {
                    uVar31 = uVar36;
                  }
                  if ((long)uVar43 <= (long)auVar97._0_8_) {
                    uVar43 = auVar97._0_8_;
                  }
                  uVar36 = vpextrq_avx(auVar97._0_16_,1);
                  if ((long)uVar44 <= (long)uVar36) {
                    uVar44 = uVar36;
                  }
                  if ((long)uVar23 <= (long)auVar97._16_8_) {
                    uVar23 = auVar97._16_8_;
                  }
                  auVar12 = vblendvpd_avx(auVar12,auVar53,auVar7);
                  auVar12 = vpsubq_avx2(auVar12,_DAT_008d4ac0);
                  auVar53 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_02 + lVar32),auVar12,
                                          auVar69);
                  auVar53 = vblendvpd_avx(auVar53,*(undefined1 (*) [32])((long)*ptr_07 + lVar32),
                                          auVar66);
                  uVar36 = vpextrq_avx(auVar97._16_16_,1);
                  if ((long)uVar31 <= (long)uVar36) {
                    uVar31 = uVar36;
                  }
                  if ((long)uVar43 <= (long)auVar53._0_8_) {
                    uVar43 = auVar53._0_8_;
                  }
                  uVar36 = vpextrq_avx(auVar53._0_16_,1);
                  if ((long)uVar44 <= (long)uVar36) {
                    uVar44 = uVar36;
                  }
                  if ((long)uVar23 <= (long)auVar53._16_8_) {
                    uVar23 = auVar53._16_8_;
                  }
                  uVar36 = vpextrq_avx(auVar53._16_16_,1);
                  if ((long)uVar31 <= (long)uVar36) {
                    uVar31 = uVar36;
                  }
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = uVar41;
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = uVar22;
                  auVar45 = vpunpcklqdq_avx(auVar62,auVar82);
                  auVar68._8_8_ = 0;
                  auVar68._0_8_ = uVar37;
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = uVar24;
                  auVar90 = vpunpcklqdq_avx(auVar77,auVar68);
                  local_1e0._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar90;
                  local_1e0._16_16_ = ZEXT116(1) * auVar45;
                  auVar93._0_32_ = local_1e0;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = uVar31;
                  auVar83._8_8_ = 0;
                  auVar83._0_8_ = uVar23;
                  auVar45 = vpunpcklqdq_avx(auVar83,auVar78);
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = uVar43;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar44;
                  auVar90 = vpunpcklqdq_avx(auVar63,auVar79);
                  auVar88._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar90;
                  auVar88._16_16_ = ZEXT116(1) * auVar45;
                  auVar89 = ZEXT3264(auVar88);
                  *(undefined1 (*) [32])((long)*ptr + lVar32) = auVar99;
                  *(undefined1 (*) [32])((long)*b_03 + lVar32) = auVar65;
                  *(undefined1 (*) [32])((long)*b_04 + lVar32) = auVar97;
                  *(undefined1 (*) [32])((long)*ptr_07 + lVar32) = auVar53;
                  lVar32 = lVar32 + 0x20;
                } while (lVar21 != lVar32);
              } while (uVar33 != uVar39);
              alVar2 = ptr[uVar42];
              auVar45 = alVar2._16_16_;
              alVar3 = b_03[uVar42];
              auVar90 = alVar3._16_16_;
              alVar4 = b_04[uVar42];
              auVar91 = alVar4._16_16_;
              alVar5 = ptr_07[uVar42];
              auVar102 = alVar5._16_16_;
              if (iVar40 / iVar38 < 3) {
                iVar18 = 1;
                if (1 < iVar16) {
                  iVar18 = iVar16;
                }
                do {
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                  alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar52,8);
                  auVar45 = alVar2._16_16_;
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                  alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar52,8);
                  auVar90 = alVar3._16_16_;
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar52,8);
                  auVar91 = alVar4._16_16_;
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                  alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar52,8);
                  auVar102 = alVar5._16_16_;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              auVar13._8_8_ = uVar29;
              auVar13._0_8_ = uVar29;
              auVar13._16_8_ = uVar29;
              auVar13._24_8_ = uVar29;
              auVar52 = vpcmpgtq_avx2(auVar13,local_1e0);
              auVar14._8_8_ = lVar27;
              auVar14._0_8_ = lVar27;
              auVar14._16_8_ = lVar27;
              auVar14._24_8_ = lVar27;
              auVar12 = vpcmpgtq_avx2(auVar88,auVar14);
              auVar52 = vpor_avx2(auVar12,auVar52);
              if ((((auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   SUB321(auVar52 >> 0x7f,0) == '\0') && SUB321(auVar52 >> 0xbf,0) == '\0') &&
                  -1 < auVar52[0x1f]) {
                uVar25 = vpextrq_avx(auVar45,1);
                iVar18 = (int)uVar25;
                uVar25 = vpextrq_avx(auVar90,1);
                iVar26 = (int)uVar25;
                uVar25 = vpextrq_avx(auVar91,1);
                iVar38 = (int)uVar25;
                uVar25 = vpextrq_avx(auVar102,1);
                iVar16 = (int)uVar25;
              }
              else {
                *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                iVar18 = 0;
                iVar26 = 0;
                iVar38 = 0;
                iVar16 = 0;
                iVar15 = 0;
                iVar40 = 0;
              }
              ppVar19->score = iVar18;
              ppVar19->end_query = iVar40;
              ppVar19->end_ref = iVar15;
              ((ppVar19->field_4).stats)->matches = iVar26;
              ((ppVar19->field_4).stats)->similar = iVar38;
              ((ppVar19->field_4).stats)->length = iVar16;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr_07);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar19;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}